

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O0

void ContextBlockSplitterFinishBlock(ContextBlockSplitter *self,MemoryManager *m,int is_final)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint *puVar4;
  long lVar5;
  int in_EDX;
  ulong *in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  size_t __brotli_swap_tmp;
  size_t last_histogram_ix;
  size_t jx;
  size_t j;
  size_t curr_histo_ix;
  size_t i_2;
  double diff [2];
  double combined_entropy [26];
  HistogramLiteral *combined_histo;
  double entropy [13];
  size_t i;
  HistogramLiteral *histograms;
  double *last_entropy;
  size_t num_contexts;
  BlockSplit *split;
  size_t i_4;
  size_t i_1;
  double retval_4;
  size_t sum_4;
  double retval_2;
  size_t sum_2;
  double retval;
  size_t sum;
  size_t i_3;
  size_t p;
  uint32_t *population_end;
  double retval_1;
  size_t sum_1;
  size_t p_1;
  uint32_t *population_end_1;
  double retval_3;
  size_t sum_3;
  size_t p_2;
  uint32_t *population_end_2;
  double retval_5;
  size_t sum_5;
  void *in_stack_fffffffffffffbe8;
  MemoryManager *in_stack_fffffffffffffbf0;
  void *local_3e8;
  ulong local_3b0;
  ulong local_3a0;
  double local_398 [29];
  void *local_2b0;
  double adStack_2a8 [13];
  ulong local_240;
  ulong local_238;
  ulong *local_230;
  ulong local_228;
  ulong *local_220;
  int local_214;
  ulong *local_208;
  ulong local_200;
  ulong local_1f8;
  long local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  long local_1d8;
  void *local_1d0;
  void *local_1c8;
  void *local_1c0;
  void *local_1b8;
  double local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  uint *local_198;
  double local_190;
  ulong local_188;
  ulong local_180;
  uint *local_178;
  double local_170;
  ulong local_168;
  ulong local_160;
  uint *local_158;
  ulong local_150;
  long local_148;
  void *local_140;
  ulong local_138;
  uint *local_130;
  double local_128;
  ulong local_120;
  ulong *local_118;
  ulong local_110;
  uint *local_108;
  ulong local_100;
  uint *local_f8;
  double local_f0;
  ulong local_e8;
  ulong *local_e0;
  ulong local_d8;
  uint *local_d0;
  ulong local_c8;
  uint *local_c0;
  double local_b8;
  ulong local_b0;
  ulong *local_a8;
  ulong local_a0;
  uint *local_98;
  ulong local_90;
  double local_88;
  ulong local_80;
  double local_78;
  ulong local_70;
  double local_68;
  ulong local_60;
  double local_58;
  ulong local_50;
  double local_48;
  ulong local_40;
  double local_38;
  ulong local_30;
  double local_28;
  ulong local_20;
  double local_18;
  ulong local_10;
  double local_8;
  undefined4 uVar30;
  undefined4 uVar31;
  
  local_220 = (ulong *)in_RDI[6];
  local_228 = in_RDI[1];
  local_230 = in_RDI + 0xe;
  local_238 = in_RDI[7];
  if (in_RDI[10] < in_RDI[3]) {
    in_RDI[10] = in_RDI[3];
  }
  local_214 = in_EDX;
  local_208 = in_RDI;
  if (in_RDI[5] == 0) {
    *(int *)local_220[3] = (int)in_RDI[10];
    *(undefined1 *)local_220[2] = 0;
    for (local_240 = 0; local_240 < local_228; local_240 = local_240 + 1) {
      local_158 = (uint *)(local_238 + local_240 * 0x410);
      local_160 = *local_208;
      local_118 = &local_168;
      local_120 = 0;
      local_128 = 0.0;
      local_130 = local_158 + local_160;
      local_110 = local_160;
      local_108 = local_158;
      if ((local_160 & 1) == 0) goto LAB_00825762;
      while( true ) {
        uVar1 = *local_108;
        local_138 = CONCAT44(0,uVar1);
        local_120 = local_120 + local_138;
        auVar8._8_4_ = 0;
        auVar8._0_8_ = local_138;
        auVar8._12_4_ = 0x45300000;
        local_30 = local_138;
        if (local_138 < 0x100) {
          local_28 = *(double *)(duckdb_brotli::kBrotliLog2Table + local_138 * 8);
          local_108 = local_108 + 1;
        }
        else {
          auVar9._8_4_ = 0;
          auVar9._0_8_ = local_138;
          auVar9._12_4_ = 0x45300000;
          local_108 = local_108 + 1;
          local_28 = log2((auVar9._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
        }
        local_128 = -((auVar8._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_28 +
                    local_128;
LAB_00825762:
        if (local_130 <= local_108) break;
        uVar1 = *local_108;
        local_138 = CONCAT44(0,uVar1);
        local_120 = local_120 + local_138;
        auVar6._8_4_ = 0;
        auVar6._0_8_ = local_138;
        auVar6._12_4_ = 0x45300000;
        local_20 = local_138;
        if (local_138 < 0x100) {
          local_18 = *(double *)(duckdb_brotli::kBrotliLog2Table + local_138 * 8);
          local_108 = local_108 + 1;
        }
        else {
          auVar7._8_4_ = 0;
          auVar7._0_8_ = local_138;
          auVar7._12_4_ = 0x45300000;
          local_108 = local_108 + 1;
          local_18 = log2((auVar7._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
        }
        local_128 = -((auVar6._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_18 +
                    local_128;
      }
      if (local_120 != 0) {
        uVar30 = (undefined4)(local_120 >> 0x20);
        auVar10._8_4_ = uVar30;
        auVar10._0_8_ = local_120;
        auVar10._12_4_ = 0x45300000;
        uVar31 = (undefined4)local_120;
        local_10 = local_120;
        if (local_120 < 0x100) {
          local_8 = *(double *)(duckdb_brotli::kBrotliLog2Table + local_120 * 8);
        }
        else {
          auVar11._8_4_ = uVar30;
          auVar11._0_8_ = local_120;
          auVar11._12_4_ = 0x45300000;
          local_8 = log2((auVar11._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,uVar31) - 4503599627370496.0));
        }
        local_128 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,uVar31) - 4503599627370496.0)) * local_8 +
                    local_128;
      }
      *local_118 = local_120;
      local_170 = local_128;
      uVar31 = (undefined4)(local_168 >> 0x20);
      auVar12._8_4_ = uVar31;
      auVar12._0_8_ = local_168;
      auVar12._12_4_ = 0x45300000;
      if (local_128 <
          (auVar12._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_168) - 4503599627370496.0)) {
        auVar13._8_4_ = uVar31;
        auVar13._0_8_ = local_168;
        auVar13._12_4_ = 0x45300000;
        local_170 = (auVar13._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_168) - 4503599627370496.0);
      }
      local_230[local_240] = (ulong)local_170;
      local_230[local_228 + local_240] = local_230[local_240];
    }
    local_208[5] = local_208[5] + 1;
    *local_220 = *local_220 + 1;
    local_208[0xb] = local_228 + local_208[0xb];
    if (local_208[0xb] < *(ulong *)local_208[8]) {
      local_1d8 = local_208[7] + local_208[0xb] * 0x410;
      local_1e0 = local_208[1];
      for (local_1e8 = 0; local_1e8 < local_1e0; local_1e8 = local_1e8 + 1) {
        local_1d0 = (void *)(local_1d8 + local_1e8 * 0x410);
        memset(local_1d0,0,0x400);
        *(undefined8 *)((long)local_1d0 + 0x400) = 0;
        *(undefined8 *)((long)local_1d0 + 0x408) = 0x7ff0000000000000;
      }
    }
    local_208[10] = 0;
  }
  else if (in_RDI[10] != 0) {
    if ((local_228 & 0x7fffffffffffffff) == 0) {
      local_3e8 = (void *)0x0;
    }
    else {
      local_3e8 = duckdb_brotli::BrotliAllocate
                            (in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8);
    }
    local_2b0 = local_3e8;
    memset(local_398,0,0x10);
    for (local_3a0 = 0; local_3a0 < local_228; local_3a0 = local_3a0 + 1) {
      uVar2 = local_208[0xb];
      local_178 = (uint *)(local_238 + (uVar2 + local_3a0) * 0x410);
      local_180 = *local_208;
      local_d0 = local_178;
      local_d8 = local_180;
      local_e0 = &local_188;
      local_e8 = 0;
      local_f0 = 0.0;
      local_f8 = local_178 + local_180;
      if ((local_180 & 1) == 0) goto LAB_00825e39;
      while( true ) {
        puVar4 = local_d0;
        local_d0 = local_d0 + 1;
        uVar1 = *puVar4;
        local_100 = CONCAT44(0,uVar1);
        local_e8 = local_e8 + local_100;
        auVar16._8_4_ = 0;
        auVar16._0_8_ = local_100;
        auVar16._12_4_ = 0x45300000;
        local_60 = local_100;
        if (local_100 < 0x100) {
          local_58 = *(double *)(duckdb_brotli::kBrotliLog2Table + local_100 * 8);
        }
        else {
          auVar17._8_4_ = 0;
          auVar17._0_8_ = local_100;
          auVar17._12_4_ = 0x45300000;
          local_58 = log2((auVar17._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
        }
        local_f0 = -((auVar16._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_58 + local_f0
        ;
LAB_00825e39:
        if (local_f8 <= local_d0) break;
        uVar1 = *local_d0;
        local_100 = CONCAT44(0,uVar1);
        local_e8 = local_e8 + local_100;
        auVar14._8_4_ = 0;
        auVar14._0_8_ = local_100;
        auVar14._12_4_ = 0x45300000;
        local_50 = local_100;
        if (local_100 < 0x100) {
          local_48 = *(double *)(duckdb_brotli::kBrotliLog2Table + local_100 * 8);
          local_d0 = local_d0 + 1;
        }
        else {
          auVar15._8_4_ = 0;
          auVar15._0_8_ = local_100;
          auVar15._12_4_ = 0x45300000;
          local_d0 = local_d0 + 1;
          local_48 = log2((auVar15._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
        }
        local_f0 = -((auVar14._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_48 + local_f0
        ;
      }
      if (local_e8 != 0) {
        uVar30 = (undefined4)(local_e8 >> 0x20);
        auVar18._8_4_ = uVar30;
        auVar18._0_8_ = local_e8;
        auVar18._12_4_ = 0x45300000;
        uVar31 = (undefined4)local_e8;
        local_40 = local_e8;
        if (local_e8 < 0x100) {
          local_38 = *(double *)(duckdb_brotli::kBrotliLog2Table + local_e8 * 8);
        }
        else {
          auVar19._8_4_ = uVar30;
          auVar19._0_8_ = local_e8;
          auVar19._12_4_ = 0x45300000;
          local_38 = log2((auVar19._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar31) - 4503599627370496.0));
        }
        local_f0 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar31) - 4503599627370496.0)) * local_38 + local_f0
        ;
      }
      *local_e0 = local_e8;
      local_190 = local_f0;
      uVar31 = (undefined4)(local_188 >> 0x20);
      auVar20._8_4_ = uVar31;
      auVar20._0_8_ = local_188;
      auVar20._12_4_ = 0x45300000;
      if (local_f0 <
          (auVar20._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_188) - 4503599627370496.0)) {
        auVar21._8_4_ = uVar31;
        auVar21._0_8_ = local_188;
        auVar21._12_4_ = 0x45300000;
        local_190 = (auVar21._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_188) - 4503599627370496.0);
      }
      adStack_2a8[local_3a0] = local_190;
      for (local_3b0 = 0; local_3b0 < 2; local_3b0 = local_3b0 + 1) {
        lVar5 = local_3b0 * local_228 + local_3a0;
        uVar3 = local_208[local_3b0 + 0xc];
        memcpy((void *)((long)local_2b0 + lVar5 * 0x410),
               (void *)(local_238 + (uVar2 + local_3a0) * 0x410),0x410);
        local_140 = (void *)((long)local_2b0 + lVar5 * 0x410);
        local_148 = local_238 + (uVar3 + local_3a0) * 0x410;
        *(long *)((long)local_140 + 0x400) =
             *(long *)(local_148 + 0x400) + *(long *)((long)local_140 + 0x400);
        for (local_150 = 0; local_150 < 0x100; local_150 = local_150 + 1) {
          *(int *)((long)local_140 + local_150 * 4) =
               *(int *)(local_148 + local_150 * 4) + *(int *)((long)local_140 + local_150 * 4);
        }
        local_198 = (uint *)((long)local_2b0 + lVar5 * 0x410);
        local_1a0 = *local_208;
        local_98 = local_198;
        local_a0 = local_1a0;
        local_a8 = &local_1a8;
        local_b0 = 0;
        local_b8 = 0.0;
        local_c0 = local_198 + local_1a0;
        if ((local_1a0 & 1) == 0) goto LAB_00826403;
        while( true ) {
          puVar4 = local_98;
          local_98 = local_98 + 1;
          uVar1 = *puVar4;
          local_c8 = CONCAT44(0,uVar1);
          local_b0 = local_b0 + local_c8;
          auVar24._8_4_ = 0;
          auVar24._0_8_ = local_c8;
          auVar24._12_4_ = 0x45300000;
          in_stack_fffffffffffffbf0 =
               (MemoryManager *)
               ((auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
          local_90 = local_c8;
          if (local_c8 < 0x100) {
            local_88 = *(double *)(duckdb_brotli::kBrotliLog2Table + local_c8 * 8);
          }
          else {
            auVar25._8_4_ = 0;
            auVar25._0_8_ = local_c8;
            auVar25._12_4_ = 0x45300000;
            local_88 = log2((auVar25._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
          }
          local_b8 = -(double)in_stack_fffffffffffffbf0 * local_88 + local_b8;
LAB_00826403:
          if (local_c0 <= local_98) break;
          uVar1 = *local_98;
          local_c8 = CONCAT44(0,uVar1);
          local_b0 = local_b0 + local_c8;
          auVar22._8_4_ = 0;
          auVar22._0_8_ = local_c8;
          auVar22._12_4_ = 0x45300000;
          local_80 = local_c8;
          if (local_c8 < 0x100) {
            local_78 = *(double *)(duckdb_brotli::kBrotliLog2Table + local_c8 * 8);
            local_98 = local_98 + 1;
          }
          else {
            auVar23._8_4_ = 0;
            auVar23._0_8_ = local_c8;
            auVar23._12_4_ = 0x45300000;
            local_98 = local_98 + 1;
            local_78 = log2((auVar23._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
          }
          local_b8 = -((auVar22._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_78 +
                     local_b8;
        }
        if (local_b0 != 0) {
          uVar31 = (undefined4)(local_b0 >> 0x20);
          auVar26._8_4_ = uVar31;
          auVar26._0_8_ = local_b0;
          auVar26._12_4_ = 0x45300000;
          in_stack_fffffffffffffbe8 =
               (void *)((auVar26._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)local_b0) - 4503599627370496.0));
          local_70 = local_b0;
          if (local_b0 < 0x100) {
            local_68 = *(double *)(duckdb_brotli::kBrotliLog2Table + local_b0 * 8);
          }
          else {
            auVar27._8_4_ = uVar31;
            auVar27._0_8_ = local_b0;
            auVar27._12_4_ = 0x45300000;
            local_68 = log2((auVar27._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)local_b0) - 4503599627370496.0));
          }
          local_b8 = (double)in_stack_fffffffffffffbe8 * local_68 + local_b8;
        }
        *local_a8 = local_b0;
        local_1b0 = local_b8;
        uVar31 = (undefined4)(local_1a8 >> 0x20);
        auVar28._8_4_ = uVar31;
        auVar28._0_8_ = local_1a8;
        auVar28._12_4_ = 0x45300000;
        if (local_b8 <
            (auVar28._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_1a8) - 4503599627370496.0)) {
          auVar29._8_4_ = uVar31;
          auVar29._0_8_ = local_1a8;
          auVar29._12_4_ = 0x45300000;
          local_1b0 = (auVar29._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_1a8) - 4503599627370496.0);
        }
        local_398[lVar5 + 2] = local_1b0;
        local_398[local_3b0] =
             ((local_398[lVar5 + 2] - adStack_2a8[local_3a0]) - (double)local_230[lVar5]) +
             local_398[local_3b0];
      }
    }
    if (((local_208[2] <= *local_220) ||
        (local_398[0] < (double)local_208[4] || local_398[0] == (double)local_208[4])) ||
       (local_398[1] < (double)local_208[4] || local_398[1] == (double)local_208[4])) {
      if (local_398[0] - 20.0 <= local_398[1]) {
        *(int *)(local_220[3] + (local_208[5] - 1) * 4) =
             (int)local_208[10] + *(int *)(local_220[3] + (local_208[5] - 1) * 4);
        for (local_3a0 = 0; local_3a0 < local_228; local_3a0 = local_3a0 + 1) {
          memcpy((void *)(local_238 + (local_208[0xc] + local_3a0) * 0x410),
                 (void *)((long)local_2b0 + local_3a0 * 0x410),0x410);
          local_230[local_3a0] = (ulong)local_398[local_3a0 + 2];
          if (*local_220 == 1) {
            local_230[local_228 + local_3a0] = local_230[local_3a0];
          }
          local_1c0 = (void *)(local_238 + (local_208[0xb] + local_3a0) * 0x410);
          memset(local_1c0,0,0x400);
          *(undefined8 *)((long)local_1c0 + 0x400) = 0;
          *(undefined8 *)((long)local_1c0 + 0x408) = 0x7ff0000000000000;
        }
        local_208[10] = 0;
        uVar2 = local_208[0x28];
        local_208[0x28] = uVar2 + 1;
        if (1 < uVar2 + 1) {
          local_208[9] = local_208[3] + local_208[9];
        }
      }
      else {
        *(int *)(local_220[3] + local_208[5] * 4) = (int)local_208[10];
        *(undefined1 *)(local_220[2] + local_208[5]) =
             *(undefined1 *)(local_220[2] + (local_208[5] - 2));
        uVar2 = local_208[0xc];
        local_208[0xc] = local_208[0xd];
        local_208[0xd] = uVar2;
        for (local_3a0 = 0; local_3a0 < local_228; local_3a0 = local_3a0 + 1) {
          memcpy((void *)(local_238 + (local_208[0xc] + local_3a0) * 0x410),
                 (void *)((long)local_2b0 + (local_228 + local_3a0) * 0x410),0x410);
          local_230[local_228 + local_3a0] = local_230[local_3a0];
          local_230[local_3a0] = (ulong)local_398[local_228 + local_3a0 + 2];
          local_1b8 = (void *)(local_238 + (local_208[0xb] + local_3a0) * 0x410);
          memset(local_1b8,0,0x400);
          *(undefined8 *)((long)local_1b8 + 0x400) = 0;
          *(undefined8 *)((long)local_1b8 + 0x408) = 0x7ff0000000000000;
        }
        local_208[5] = local_208[5] + 1;
        local_208[10] = 0;
        local_208[0x28] = 0;
        local_208[9] = local_208[3];
      }
    }
    else {
      *(int *)(local_220[3] + local_208[5] * 4) = (int)local_208[10];
      *(char *)(local_220[2] + local_208[5]) = (char)*local_220;
      local_208[0xd] = local_208[0xc];
      local_208[0xc] = *local_220 * local_228;
      for (local_3a0 = 0; local_3a0 < local_228; local_3a0 = local_3a0 + 1) {
        local_230[local_228 + local_3a0] = local_230[local_3a0];
        local_230[local_3a0] = (ulong)adStack_2a8[local_3a0];
      }
      local_208[5] = local_208[5] + 1;
      *local_220 = *local_220 + 1;
      local_208[0xb] = local_228 + local_208[0xb];
      if (local_208[0xb] < *(ulong *)local_208[8]) {
        local_1f0 = local_208[7] + local_208[0xb] * 0x410;
        local_1f8 = local_208[1];
        for (local_200 = 0; local_200 < local_1f8; local_200 = local_200 + 1) {
          local_1c8 = (void *)(local_1f0 + local_200 * 0x410);
          memset(local_1c8,0,0x400);
          *(undefined8 *)((long)local_1c8 + 0x400) = 0;
          *(undefined8 *)((long)local_1c8 + 0x408) = 0x7ff0000000000000;
        }
      }
      local_208[10] = 0;
      local_208[0x28] = 0;
      local_208[9] = local_208[3];
    }
    duckdb_brotli::BrotliFree(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  }
  if (local_214 != 0) {
    *(ulong *)local_208[8] = *local_220 * local_228;
    local_220[1] = local_208[5];
  }
  return;
}

Assistant:

static void ContextBlockSplitterFinishBlock(
    ContextBlockSplitter* self, MemoryManager* m, BROTLI_BOOL is_final) {
  BlockSplit* split = self->split_;
  const size_t num_contexts = self->num_contexts_;
  double* last_entropy = self->last_entropy_;
  HistogramLiteral* histograms = self->histograms_;

  if (self->block_size_ < self->min_block_size_) {
    self->block_size_ = self->min_block_size_;
  }
  if (self->num_blocks_ == 0) {
    size_t i;
    /* Create first block. */
    split->lengths[0] = (uint32_t)self->block_size_;
    split->types[0] = 0;

    for (i = 0; i < num_contexts; ++i) {
      last_entropy[i] =
          BitsEntropy(histograms[i].data_, self->alphabet_size_);
      last_entropy[num_contexts + i] = last_entropy[i];
    }
    ++self->num_blocks_;
    ++split->num_types;
    self->curr_histogram_ix_ += num_contexts;
    if (self->curr_histogram_ix_ < *self->histograms_size_) {
      ClearHistogramsLiteral(
          &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
    }
    self->block_size_ = 0;
  } else if (self->block_size_ > 0) {
    /* Try merging the set of histograms for the current block type with the
       respective set of histograms for the last and second last block types.
       Decide over the split based on the total reduction of entropy across
       all contexts. */
    double entropy[BROTLI_MAX_STATIC_CONTEXTS];
    HistogramLiteral* combined_histo =
        BROTLI_ALLOC(m, HistogramLiteral, 2 * num_contexts);
    double combined_entropy[2 * BROTLI_MAX_STATIC_CONTEXTS];
    double diff[2] = { 0.0 };
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(combined_histo)) return;
    for (i = 0; i < num_contexts; ++i) {
      size_t curr_histo_ix = self->curr_histogram_ix_ + i;
      size_t j;
      entropy[i] = BitsEntropy(histograms[curr_histo_ix].data_,
                               self->alphabet_size_);
      for (j = 0; j < 2; ++j) {
        size_t jx = j * num_contexts + i;
        size_t last_histogram_ix = self->last_histogram_ix_[j] + i;
        combined_histo[jx] = histograms[curr_histo_ix];
        HistogramAddHistogramLiteral(&combined_histo[jx],
            &histograms[last_histogram_ix]);
        combined_entropy[jx] = BitsEntropy(
            &combined_histo[jx].data_[0], self->alphabet_size_);
        diff[j] += combined_entropy[jx] - entropy[i] - last_entropy[jx];
      }
    }

    if (split->num_types < self->max_block_types_ &&
        diff[0] > self->split_threshold_ &&
        diff[1] > self->split_threshold_) {
      /* Create new block. */
      split->lengths[self->num_blocks_] = (uint32_t)self->block_size_;
      split->types[self->num_blocks_] = (uint8_t)split->num_types;
      self->last_histogram_ix_[1] = self->last_histogram_ix_[0];
      self->last_histogram_ix_[0] = split->num_types * num_contexts;
      for (i = 0; i < num_contexts; ++i) {
        last_entropy[num_contexts + i] = last_entropy[i];
        last_entropy[i] = entropy[i];
      }
      ++self->num_blocks_;
      ++split->num_types;
      self->curr_histogram_ix_ += num_contexts;
      if (self->curr_histogram_ix_ < *self->histograms_size_) {
        ClearHistogramsLiteral(
            &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
      }
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      self->target_block_size_ = self->min_block_size_;
    } else if (diff[1] < diff[0] - 20.0) {
      /* Combine this block with second last block. */
      split->lengths[self->num_blocks_] = (uint32_t)self->block_size_;
      split->types[self->num_blocks_] = split->types[self->num_blocks_ - 2];
      BROTLI_SWAP(size_t, self->last_histogram_ix_, 0, 1);
      for (i = 0; i < num_contexts; ++i) {
        histograms[self->last_histogram_ix_[0] + i] =
            combined_histo[num_contexts + i];
        last_entropy[num_contexts + i] = last_entropy[i];
        last_entropy[i] = combined_entropy[num_contexts + i];
        HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
      }
      ++self->num_blocks_;
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      self->target_block_size_ = self->min_block_size_;
    } else {
      /* Combine this block with last block. */
      split->lengths[self->num_blocks_ - 1] += (uint32_t)self->block_size_;
      for (i = 0; i < num_contexts; ++i) {
        histograms[self->last_histogram_ix_[0] + i] = combined_histo[i];
        last_entropy[i] = combined_entropy[i];
        if (split->num_types == 1) {
          last_entropy[num_contexts + i] = last_entropy[i];
        }
        HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
      }
      self->block_size_ = 0;
      if (++self->merge_last_count_ > 1) {
        self->target_block_size_ += self->min_block_size_;
      }
    }
    BROTLI_FREE(m, combined_histo);
  }
  if (is_final) {
    *self->histograms_size_ = split->num_types * num_contexts;
    split->num_blocks = self->num_blocks_;
  }
}